

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O1

CharString * __thiscall
icu_63::CharString::copyFrom(CharString *this,CharString *s,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  
  if ((this != s) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    UVar2 = ensureCapacity(this,s->len + 1,0,errorCode);
    if (UVar2 != '\0') {
      iVar1 = s->len;
      this->len = iVar1;
      memcpy((this->buffer).ptr,(s->buffer).ptr,(long)iVar1 + 1);
    }
  }
  return this;
}

Assistant:

CharString &CharString::copyFrom(const CharString &s, UErrorCode &errorCode) {
    if(U_SUCCESS(errorCode) && this!=&s && ensureCapacity(s.len+1, 0, errorCode)) {
        len=s.len;
        uprv_memcpy(buffer.getAlias(), s.buffer.getAlias(), len+1);
    }
    return *this;
}